

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_resume_data.cpp
# Opt level: O2

entry * libtorrent::write_resume_data(entry *__return_storage_ptr__,add_torrent_params *atp)

{
  byte *pbVar1;
  storage_mode_t sVar2;
  int iVar3;
  _Rb_tree_color _Var4;
  integer_type iVar5;
  unsigned_long uVar6;
  pointer __src;
  _Base_ptr p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  basic_endpoint<boost::asio::ip::tcp> *pbVar9;
  pointer psVar10;
  undefined1 *puVar11;
  entry *peVar12;
  element_type *peVar13;
  vector<char,std::allocator<char>> *pvVar14;
  char *pcVar15;
  string_type *psVar16;
  list_type *plVar17;
  _Base_ptr p_Var18;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *this;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *this_00;
  back_insert_iterator<std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_> bVar19;
  ulong uVar20;
  string *tr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  basic_endpoint<boost::asio::ip::tcp> *pbVar21;
  char *pcVar22;
  long lVar23;
  shared_array<char> *psVar24;
  uint uVar25;
  _Head_base<0UL,_unsigned_int_*,_false> _Var26;
  uint *puVar27;
  pointer psVar28;
  bool bVar29;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view key_12;
  string_view key_13;
  string_view key_14;
  string_view key_15;
  string_view key_16;
  string_view key_17;
  string_view key_18;
  string_view key_19;
  string_view key_20;
  string_view key_21;
  string_view key_22;
  span<const_char> v;
  string_view key_23;
  string_view key_24;
  string_view key_25;
  string_view key_26;
  string_view key_27;
  string_view key_28;
  string_view key_29;
  string_view key_30;
  string_view key_31;
  string_view key_32;
  string_view key_33;
  string_view key_34;
  string_view key_35;
  string_view key_36;
  string_view key_37;
  string_view key_38;
  string_view key_39;
  string_view key_40;
  string_view key_41;
  string_view key_42;
  string_view key_43;
  string_view key_44;
  string_view key_45;
  string_view key_46;
  string_view key_47;
  string_view key_48;
  const_iterator cVar30;
  shared_array<char> info;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ptr6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  entry::entry(__return_storage_ptr__);
  key.len_ = 0xb;
  key.ptr_ = "file-format";
  peVar12 = entry::operator[](__return_storage_ptr__,key);
  entry::operator=(peVar12,"libtorrent resume file");
  key_00.len_ = 0xc;
  key_00.ptr_ = "file-version";
  peVar12 = entry::operator[](__return_storage_ptr__,key_00);
  entry::operator=(peVar12,1);
  key_01.len_ = 0x12;
  key_01.ptr_ = "libtorrent-version";
  peVar12 = entry::operator[](__return_storage_ptr__,key_01);
  entry::operator=(peVar12,"1.2.6.0");
  sVar2 = atp->storage_mode;
  key_02.len_ = 10;
  key_02.ptr_ = "allocation";
  peVar12 = entry::operator[](__return_storage_ptr__,key_02);
  pcVar22 = "sparse";
  if (sVar2 == storage_mode_allocate) {
    pcVar22 = "allocate";
  }
  entry::operator=(peVar12,pcVar22);
  iVar5 = atp->total_uploaded;
  key_03.len_ = 0xe;
  key_03.ptr_ = "total_uploaded";
  peVar12 = entry::operator[](__return_storage_ptr__,key_03);
  entry::operator=(peVar12,iVar5);
  iVar5 = atp->total_downloaded;
  key_04.len_ = 0x10;
  key_04.ptr_ = "total_downloaded";
  peVar12 = entry::operator[](__return_storage_ptr__,key_04);
  entry::operator=(peVar12,iVar5);
  iVar3 = atp->active_time;
  key_05.len_ = 0xb;
  key_05.ptr_ = "active_time";
  peVar12 = entry::operator[](__return_storage_ptr__,key_05);
  entry::operator=(peVar12,(long)iVar3);
  iVar3 = atp->finished_time;
  key_06.len_ = 0xd;
  key_06.ptr_ = "finished_time";
  peVar12 = entry::operator[](__return_storage_ptr__,key_06);
  entry::operator=(peVar12,(long)iVar3);
  iVar3 = atp->seeding_time;
  key_07.len_ = 0xc;
  key_07.ptr_ = "seeding_time";
  peVar12 = entry::operator[](__return_storage_ptr__,key_07);
  entry::operator=(peVar12,(long)iVar3);
  iVar5 = atp->last_seen_complete;
  key_08.len_ = 0x12;
  key_08.ptr_ = "last_seen_complete";
  peVar12 = entry::operator[](__return_storage_ptr__,key_08);
  entry::operator=(peVar12,iVar5);
  iVar5 = atp->last_download;
  key_09.len_ = 0xd;
  key_09.ptr_ = "last_download";
  peVar12 = entry::operator[](__return_storage_ptr__,key_09);
  entry::operator=(peVar12,iVar5);
  iVar5 = atp->last_upload;
  key_10.len_ = 0xb;
  key_10.ptr_ = "last_upload";
  peVar12 = entry::operator[](__return_storage_ptr__,key_10);
  entry::operator=(peVar12,iVar5);
  iVar3 = atp->num_complete;
  key_11.len_ = 0xc;
  key_11.ptr_ = "num_complete";
  peVar12 = entry::operator[](__return_storage_ptr__,key_11);
  entry::operator=(peVar12,(long)iVar3);
  iVar3 = atp->num_incomplete;
  key_12.len_ = 0xe;
  key_12.ptr_ = "num_incomplete";
  peVar12 = entry::operator[](__return_storage_ptr__,key_12);
  entry::operator=(peVar12,(long)iVar3);
  iVar3 = atp->num_downloaded;
  key_13.len_ = 0xe;
  key_13.ptr_ = "num_downloaded";
  peVar12 = entry::operator[](__return_storage_ptr__,key_13);
  entry::operator=(peVar12,(long)iVar3);
  uVar20 = (atp->flags).m_val;
  key_14.len_ = 0x13;
  key_14.ptr_ = "sequential_download";
  peVar12 = entry::operator[](__return_storage_ptr__,key_14);
  entry::operator=(peVar12,(ulong)((uint)(uVar20 >> 9) & 1));
  uVar6 = (atp->flags).m_val;
  key_15.len_ = 9;
  key_15.ptr_ = "seed_mode";
  peVar12 = entry::operator[](__return_storage_ptr__,key_15);
  entry::operator=(peVar12,(ulong)((uint)uVar6 & 1));
  uVar6 = (atp->flags).m_val;
  key_16.len_ = 0xd;
  key_16.ptr_ = "super_seeding";
  peVar12 = entry::operator[](__return_storage_ptr__,key_16);
  entry::operator=(peVar12,(ulong)((uint)(uVar6 >> 8) & 1));
  iVar5 = atp->added_time;
  key_17.len_ = 10;
  key_17.ptr_ = "added_time";
  peVar12 = entry::operator[](__return_storage_ptr__,key_17);
  entry::operator=(peVar12,iVar5);
  iVar5 = atp->completed_time;
  key_18.len_ = 0xe;
  key_18.ptr_ = "completed_time";
  peVar12 = entry::operator[](__return_storage_ptr__,key_18);
  entry::operator=(peVar12,iVar5);
  std::__cxx11::string::string((string *)&local_70,(string *)&atp->save_path);
  key_19.len_ = 9;
  key_19.ptr_ = "save_path";
  peVar12 = entry::operator[](__return_storage_ptr__,key_19);
  entry::operator=(peVar12,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if ((atp->url)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_90,(string *)&atp->url);
    key_20.len_ = 3;
    key_20.ptr_ = "url";
    peVar12 = entry::operator[](__return_storage_ptr__,key_20);
    entry::operator=(peVar12,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((atp->uuid)._M_string_length != 0) {
    std::__cxx11::string::string((string *)&local_b0,(string *)&atp->uuid);
    key_21.len_ = 4;
    key_21.ptr_ = "uuid";
    peVar12 = entry::operator[](__return_storage_ptr__,key_21);
    entry::operator=(peVar12,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  key_22.len_ = 9;
  key_22.ptr_ = "info-hash";
  peVar12 = entry::operator[](__return_storage_ptr__,key_22);
  v.m_len = 0x14;
  v.m_ptr = (char *)&atp->info_hash;
  entry::operator=(peVar12,v);
  peVar13 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (peVar13 != (element_type *)0x0) {
    info.px = (peVar13->m_info_section).px;
    info.pn.pi_ = (peVar13->m_info_section).pn.pi_;
    if (info.pn.pi_ != (sp_counted_base *)0x0) {
      LOCK();
      (info.pn.pi_)->use_count_ = (info.pn.pi_)->use_count_ + 1;
      UNLOCK();
      peVar13 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    }
    iVar3 = peVar13->m_info_section_size;
    key_23.len_ = 4;
    key_23.ptr_ = "info";
    peVar12 = entry::operator[](__return_storage_ptr__,key_23);
    pvVar14 = (vector<char,std::allocator<char>> *)entry::preformatted(peVar12);
    pcVar22 = boost::shared_array<char>::operator[](&info,0);
    pcVar15 = boost::shared_array<char>::operator[](&info,0);
    std::vector<char,std::allocator<char>>::_M_assign_aux<char*>(pvVar14,pcVar22,pcVar15 + iVar3);
    peVar13 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if ((peVar13->m_comment)._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_d0,(string *)&peVar13->m_comment);
      key_24.len_ = 7;
      key_24.ptr_ = "comment";
      peVar12 = entry::operator[](__return_storage_ptr__,key_24);
      entry::operator=(peVar12,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      peVar13 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    }
    lVar23 = peVar13->m_creation_date;
    if (lVar23 != 0) {
      key_25.len_ = 0xd;
      key_25.ptr_ = "creation date";
      peVar12 = entry::operator[](__return_storage_ptr__,key_25);
      entry::operator=(peVar12,lVar23);
      peVar13 = (atp->ti).super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    }
    if ((peVar13->m_created_by)._M_string_length != 0) {
      std::__cxx11::string::string((string *)&local_f0,(string *)&peVar13->m_created_by);
      key_26.len_ = 10;
      key_26.ptr_ = "created by";
      peVar12 = entry::operator[](__return_storage_ptr__,key_26);
      entry::operator=(peVar12,&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    boost::detail::shared_count::~shared_count(&info.pn);
  }
  if ((atp->merkle_tree).
      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (atp->merkle_tree).
      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    key_27.len_ = 0xb;
    key_27.ptr_ = "merkle tree";
    peVar12 = entry::operator[](__return_storage_ptr__,key_27);
    psVar16 = entry::string_abi_cxx11_(peVar12);
    std::__cxx11::string::resize((ulong)psVar16);
    __src = (atp->merkle_tree).
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
    memcpy((psVar16->_M_dataplus)._M_p,__src,
           (long)(atp->merkle_tree).
                 super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 .
                 super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)__src);
  }
  if ((atp->unfinished_pieces).
      super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    key_28.len_ = 10;
    key_28.ptr_ = "unfinished";
    peVar12 = entry::operator[](__return_storage_ptr__,key_28);
    plVar17 = entry::list(peVar12);
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (plVar17,(atp->unfinished_pieces).
                       super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                       ._M_t._M_impl.super__Rb_tree_header._M_node_count);
    for (p_Var18 = (atp->unfinished_pieces).
                   super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
                   ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var18 !=
        &(atp->unfinished_pieces).
         super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::bitfield>_>_>
         ._M_t._M_impl.super__Rb_tree_header; p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18))
    {
      entry::entry((entry *)&info,dictionary_t);
      _Var4 = p_Var18[1]._M_color;
      key_29.len_ = 5;
      key_29.ptr_ = "piece";
      peVar12 = entry::operator[]((entry *)&info,key_29);
      entry::operator=(peVar12,(long)(int)_Var4);
      p_Var7 = p_Var18[1]._M_parent;
      puVar11 = &p_Var7->field_0x4;
      if (p_Var7 == (_Base_ptr)0x0) {
        uVar20 = 0;
        puVar11 = (undefined1 *)0x0;
      }
      else {
        uVar20 = (long)(int)p_Var7->_M_color + 7U >> 3;
      }
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,puVar11,puVar11 + uVar20)
      ;
      key_30.len_ = 7;
      key_30.ptr_ = "bitmask";
      peVar12 = entry::operator[]((entry *)&info,key_30);
      entry::operator=(peVar12,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::
      emplace_back<libtorrent::entry>(plVar17,(entry *)&info);
      entry::~entry((entry *)&info);
    }
  }
  key_31.len_ = 8;
  key_31.ptr_ = "trackers";
  peVar12 = entry::operator[](__return_storage_ptr__,key_31);
  this = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar12);
  if ((atp->trackers).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->trackers).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    info.px = (char *)0x0;
    info.pn.pi_ = (sp_counted_base *)0x0;
    std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
    emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
              (this,(vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&info);
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)&info);
    puVar27 = (uint *)(atp->tracker_tiers).super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start;
    pbVar8 = (atp->trackers).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar20 = 0;
    for (__args = (atp->trackers).
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; __args != pbVar8; __args = __args + 1)
    {
      if (puVar27 !=
          (uint *)(atp->tracker_tiers).super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_finish) {
        uVar25 = *puVar27;
        puVar27 = puVar27 + 1;
        uVar20 = (ulong)uVar25;
        if (0x3ff < uVar25) {
          uVar20 = 0x400;
        }
      }
      lVar23 = *(long *)this;
      if ((ulong)((*(long *)(this + 8) - lVar23) / 0x38) <= uVar20) {
        std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::resize
                  ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)this,uVar20 + 1)
        ;
        lVar23 = *(long *)this;
      }
      this_00 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)
                entry::list((entry *)(uVar20 * 0x38 + lVar23));
      std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string_const&>(this_00,__args);
    }
  }
  key_32.len_ = 8;
  key_32.ptr_ = "url-list";
  peVar12 = entry::operator[](__return_storage_ptr__,key_32);
  bVar19.container = entry::list(peVar12);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
            ((atp->url_seeds).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (atp->url_seeds).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,bVar19);
  key_33.len_ = 9;
  key_33.ptr_ = "httpseeds";
  peVar12 = entry::operator[](__return_storage_ptr__,key_33);
  bVar19.container = entry::list(peVar12);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<std::__cxx11::string_const*,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
            ((atp->http_seeds).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (atp->http_seeds).
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,bVar19);
  key_34.len_ = 6;
  key_34.ptr_ = "pieces";
  peVar12 = entry::operator[](__return_storage_ptr__,key_34);
  psVar16 = entry::string_abi_cxx11_(peVar12);
  std::__cxx11::string::resize((ulong)psVar16);
  _Var26._M_head_impl =
       *(uint **)&(atp->have_pieces).super_bitfield.m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var26._M_head_impl !=
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    _Var26._M_head_impl = _Var26._M_head_impl + 1;
  }
  cVar30 = bitfield::end(&(atp->have_pieces).super_bitfield);
  lVar23 = 0;
  uVar25 = 0x80000000;
  while (uVar25 != cVar30.bit || _Var26._M_head_impl != cVar30.buf) {
    (psVar16->_M_dataplus)._M_p[lVar23] =
         (*_Var26._M_head_impl &
         (uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 | uVar25 << 0x18)) != 0
    ;
    lVar23 = lVar23 + 1;
    bVar29 = uVar25 == 1;
    _Var26._M_head_impl = _Var26._M_head_impl + bVar29;
    uVar25 = uVar25 >> 1;
    if (bVar29) {
      uVar25 = 0x80000000;
    }
  }
  _Var26._M_head_impl =
       *(uint **)&(atp->verified_pieces).super_bitfield.m_buf.
                  super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
                  super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>;
  puVar27 = _Var26._M_head_impl + 1;
  if ((_Head_base<0UL,_unsigned_int_*,_false>)_Var26._M_head_impl ==
      (_Head_base<0UL,_unsigned_int_*,_false>)0x0) {
    puVar27 = (uint *)0x0;
  }
  cVar30 = bitfield::end(&(atp->verified_pieces).super_bitfield);
  lVar23 = 0;
  uVar25 = 0x80000000;
  while (uVar25 != cVar30.bit || puVar27 != cVar30.buf) {
    pbVar1 = (byte *)((psVar16->_M_dataplus)._M_p + lVar23);
    *pbVar1 = *pbVar1 | ((*puVar27 &
                         (uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 |
                         uVar25 << 0x18)) != 0) * '\x02';
    lVar23 = lVar23 + 1;
    bVar29 = uVar25 == 1;
    puVar27 = puVar27 + bVar29;
    uVar25 = uVar25 >> 1;
    if (bVar29) {
      uVar25 = 0x80000000;
    }
  }
  if ((atp->renamed_files).
      super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    key_35.len_ = 0xc;
    key_35.ptr_ = "mapped_files";
    peVar12 = entry::operator[](__return_storage_ptr__,key_35);
    plVar17 = entry::list(peVar12);
    for (p_Var18 = (atp->renamed_files).
                   super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var18 !=
        &(atp->renamed_files).
         super_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_t._M_impl.super__Rb_tree_header; p_Var18 = (_Base_ptr)std::_Rb_tree_increment(p_Var18))
    {
      uVar20 = (ulong)(int)p_Var18[1]._M_color;
      if ((ulong)(((long)(plVar17->
                         super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>).
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(plVar17->
                        super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>).
                        _M_impl.super__Vector_impl_data._M_start) / 0x38) <= uVar20) {
        std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::resize
                  (plVar17,uVar20 + 1);
      }
      std::__cxx11::string::string((string *)&local_50,(string *)&p_Var18[1]._M_parent);
      entry::operator=((plVar17->
                       super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar20,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((atp->peers).
      super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      .
      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->peers).
      super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      .
      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_36.len_ = 5;
    key_36.ptr_ = "peers";
    peVar12 = entry::operator[](__return_storage_ptr__,key_36);
    info.px = (char *)entry::string_abi_cxx11_(peVar12);
    key_37.len_ = 6;
    key_37.ptr_ = "peers6";
    peVar12 = entry::operator[](__return_storage_ptr__,key_37);
    ptr6.container = entry::string_abi_cxx11_(peVar12);
    pbVar9 = (atp->peers).
             super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             .
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar21 = (atp->peers).
                   super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   .
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar9;
        pbVar21 = pbVar21 + 1) {
      psVar24 = &info;
      if ((pbVar21->impl_).data_.base.sa_family != 2) {
        psVar24 = (shared_array<char> *)&ptr6;
      }
      detail::
      write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                (pbVar21,(back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)psVar24);
    }
  }
  if ((atp->banned_peers).
      super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      .
      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->banned_peers).
      super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      .
      super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_38.len_ = 0xc;
    key_38.ptr_ = "banned_peers";
    peVar12 = entry::operator[](__return_storage_ptr__,key_38);
    info.px = (char *)entry::string_abi_cxx11_(peVar12);
    key_39.len_ = 0xd;
    key_39.ptr_ = "banned_peers6";
    peVar12 = entry::operator[](__return_storage_ptr__,key_39);
    ptr6.container = entry::string_abi_cxx11_(peVar12);
    pbVar9 = (atp->banned_peers).
             super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             .
             super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar21 = (atp->banned_peers).
                   super_vector<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   .
                   super__Vector_base<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar9;
        pbVar21 = pbVar21 + 1) {
      psVar24 = &info;
      if ((pbVar21->impl_).data_.base.sa_family != 2) {
        psVar24 = (shared_array<char> *)&ptr6;
      }
      detail::
      write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,std::back_insert_iterator<std::__cxx11::string>&>
                (pbVar21,(back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)psVar24);
    }
  }
  iVar3 = atp->upload_limit;
  key_40.len_ = 0x11;
  key_40.ptr_ = "upload_rate_limit";
  peVar12 = entry::operator[](__return_storage_ptr__,key_40);
  entry::operator=(peVar12,(long)iVar3);
  iVar3 = atp->download_limit;
  key_41.len_ = 0x13;
  key_41.ptr_ = "download_rate_limit";
  peVar12 = entry::operator[](__return_storage_ptr__,key_41);
  entry::operator=(peVar12,(long)iVar3);
  iVar3 = atp->max_connections;
  key_42.len_ = 0xf;
  key_42.ptr_ = "max_connections";
  peVar12 = entry::operator[](__return_storage_ptr__,key_42);
  entry::operator=(peVar12,(long)iVar3);
  iVar3 = atp->upload_limit;
  key_43.len_ = 0xb;
  key_43.ptr_ = "max_uploads";
  peVar12 = entry::operator[](__return_storage_ptr__,key_43);
  entry::operator=(peVar12,(long)iVar3);
  uVar20 = (atp->flags).m_val;
  key_44.len_ = 6;
  key_44.ptr_ = "paused";
  peVar12 = entry::operator[](__return_storage_ptr__,key_44);
  entry::operator=(peVar12,(ulong)((uint)(uVar20 >> 4) & 1));
  uVar20 = (atp->flags).m_val;
  key_45.len_ = 0xc;
  key_45.ptr_ = "auto_managed";
  peVar12 = entry::operator[](__return_storage_ptr__,key_45);
  entry::operator=(peVar12,(ulong)((uint)(uVar20 >> 5) & 1));
  uVar20 = (atp->flags).m_val;
  key_46.len_ = 0xf;
  key_46.ptr_ = "stop_when_ready";
  peVar12 = entry::operator[](__return_storage_ptr__,key_46);
  entry::operator=(peVar12,(ulong)((uint)(uVar20 >> 10) & 1));
  if ((atp->file_priorities).
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->file_priorities).
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_47.len_ = 0xd;
    key_47.ptr_ = "file_priority";
    peVar12 = entry::operator[](__return_storage_ptr__,key_47);
    plVar17 = entry::list(peVar12);
    std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              (plVar17,(long)(atp->file_priorities).
                             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             .
                             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(atp->file_priorities).
                             super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             .
                             super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    psVar10 = (atp->file_priorities).
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              .
              super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar28 = (atp->file_priorities).
                   super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   .
                   super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar28 != psVar10;
        psVar28 = psVar28 + 1) {
      info.px = (char *)CONCAT71(info.px._1_7_,psVar28->m_val);
      std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::
      emplace_back<unsigned_char>(plVar17,(uchar *)&info);
    }
  }
  if ((atp->piece_priorities).
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (atp->piece_priorities).
      super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      .
      super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    key_48.len_ = 0xe;
    key_48.ptr_ = "piece_priority";
    peVar12 = entry::operator[](__return_storage_ptr__,key_48);
    psVar16 = entry::string_abi_cxx11_(peVar12);
    std::__cxx11::string::reserve((ulong)psVar16);
    psVar10 = (atp->piece_priorities).
              super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              .
              super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar28 = (atp->piece_priorities).
                   super_vector<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   .
                   super__Vector_base<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<unsigned_char,_libtorrent::download_priority_tag,_void>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar28 != psVar10;
        psVar28 = psVar28 + 1) {
      std::__cxx11::string::push_back((char)psVar16);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

entry write_resume_data(add_torrent_params const& atp)
	{
		entry ret;

		using namespace libtorrent::detail; // for write_*_endpoint()
		ret["file-format"] = "libtorrent resume file";
		ret["file-version"] = 1;
		ret["libtorrent-version"] = LIBTORRENT_VERSION;
		ret["allocation"] = atp.storage_mode == storage_mode_allocate
			? "allocate" : "sparse";

		ret["total_uploaded"] = atp.total_uploaded;
		ret["total_downloaded"] = atp.total_downloaded;

		// cast to seconds in case that internal values doesn't have ratio<1>
		ret["active_time"] = atp.active_time;
		ret["finished_time"] = atp.finished_time;
		ret["seeding_time"] = atp.seeding_time;
		ret["last_seen_complete"] = atp.last_seen_complete;
		ret["last_download"] = atp.last_download;
		ret["last_upload"] = atp.last_upload;

		ret["num_complete"] = atp.num_complete;
		ret["num_incomplete"] = atp.num_incomplete;
		ret["num_downloaded"] = atp.num_downloaded;

		ret["sequential_download"] = bool(atp.flags & torrent_flags::sequential_download);

		ret["seed_mode"] = bool(atp.flags & torrent_flags::seed_mode);
		ret["super_seeding"] = bool(atp.flags & torrent_flags::super_seeding);

		ret["added_time"] = atp.added_time;
		ret["completed_time"] = atp.completed_time;

		ret["save_path"] = atp.save_path;

#if TORRENT_ABI_VERSION == 1
		// deprecated in 1.2
		if (!atp.url.empty()) ret["url"] = atp.url;
		if (!atp.uuid.empty()) ret["uuid"] = atp.uuid;
#endif

		ret["info-hash"] = atp.info_hash;

		if (atp.ti)
		{
			auto const info = atp.ti->metadata();
			int const size = atp.ti->metadata_size();
			ret["info"].preformatted().assign(&info[0], &info[0] + size);
			if (!atp.ti->comment().empty())
				ret["comment"] = atp.ti->comment();
			if (atp.ti->creation_date() != 0)
				ret["creation date"] = atp.ti->creation_date();
			if (!atp.ti->creator().empty())
				ret["created by"] = atp.ti->creator();
		}

		if (!atp.merkle_tree.empty())
		{
			// we need to save the whole merkle hash tree
			// in order to resume
			std::string& tree_str = ret["merkle tree"].string();
			auto const& tree = atp.merkle_tree;
			tree_str.resize(tree.size() * 20);
			std::memcpy(&tree_str[0], &tree[0], tree.size() * 20);
		}

		if (!atp.unfinished_pieces.empty())
		{
			entry::list_type& up = ret["unfinished"].list();
			up.reserve(atp.unfinished_pieces.size());

			// info for each unfinished piece
			for (auto const& p : atp.unfinished_pieces)
			{
				entry piece_struct(entry::dictionary_t);

				// the unfinished piece's index
				piece_struct["piece"] = static_cast<int>(p.first);
				piece_struct["bitmask"] = std::string(p.second.data(), std::size_t(p.second.size() + 7) / 8);
				// push the struct onto the unfinished-piece list
				up.push_back(std::move(piece_struct));
			}
		}

		// save trackers
		entry::list_type& tr_list = ret["trackers"].list();
		if (!atp.trackers.empty())
		{
			tr_list.emplace_back(entry::list_type());
			std::size_t tier = 0;
			auto tier_it = atp.tracker_tiers.begin();
			for (std::string const& tr : atp.trackers)
			{
				if (tier_it != atp.tracker_tiers.end())
					tier = aux::clamp(std::size_t(*tier_it++), std::size_t{0}, std::size_t{1024});

				if (tr_list.size() <= tier)
					tr_list.resize(tier + 1);

				tr_list[tier].list().emplace_back(tr);
			}
		}

		// save web seeds
		entry::list_type& url_list = ret["url-list"].list();
		std::copy(atp.url_seeds.begin(), atp.url_seeds.end(), std::back_inserter(url_list));

		entry::list_type& httpseeds_list = ret["httpseeds"].list();
		std::copy(atp.http_seeds.begin(), atp.http_seeds.end(), std::back_inserter(httpseeds_list));

		// write have bitmask
		entry::string_type& pieces = ret["pieces"].string();
		pieces.resize(aux::numeric_cast<std::size_t>(std::max(
			atp.have_pieces.size(), atp.verified_pieces.size())));

		std::size_t piece(0);
		for (auto const bit : atp.have_pieces)
		{
			pieces[piece] = bit ? 1 : 0;
			++piece;
		}

		piece = 0;
		for (auto const bit : atp.verified_pieces)
		{
			pieces[piece] |= bit ? 2 : 0;
			++piece;
		}

		// write renamed files
		if (!atp.renamed_files.empty())
		{
			entry::list_type& fl = ret["mapped_files"].list();
			for (auto const& ent : atp.renamed_files)
			{
				std::size_t const idx(static_cast<std::size_t>(static_cast<int>(ent.first)));
				if (idx >= fl.size()) fl.resize(idx + 1);
				fl[idx] = ent.second;
			}
		}

		// write local peers
		if (!atp.peers.empty())
		{
			std::back_insert_iterator<entry::string_type> ptr(ret["peers"].string());
			std::back_insert_iterator<entry::string_type> ptr6(ret["peers6"].string());
			for (auto const& p : atp.peers)
			{
				if (is_v6(p))
					write_endpoint(p, ptr6);
				else
					write_endpoint(p, ptr);
			}
		}

		if (!atp.banned_peers.empty())
		{
			std::back_insert_iterator<entry::string_type> ptr(ret["banned_peers"].string());
			std::back_insert_iterator<entry::string_type> ptr6(ret["banned_peers6"].string());
			for (auto const& p : atp.banned_peers)
			{
				if (is_v6(p))
					write_endpoint(p, ptr6);
				else
					write_endpoint(p, ptr);
			}
		}

		ret["upload_rate_limit"] = atp.upload_limit;
		ret["download_rate_limit"] = atp.download_limit;
		ret["max_connections"] = atp.max_connections;
		ret["max_uploads"] = atp.upload_limit;
		ret["paused"] = bool(atp.flags & torrent_flags::paused);
		ret["auto_managed"] = bool(atp.flags & torrent_flags::auto_managed);
		ret["stop_when_ready"] = bool(atp.flags & torrent_flags::stop_when_ready);

		if (!atp.file_priorities.empty())
		{
			// write file priorities
			entry::list_type& prio = ret["file_priority"].list();
			prio.reserve(atp.file_priorities.size());
			for (auto const p : atp.file_priorities)
				prio.emplace_back(static_cast<std::uint8_t>(p));
		}

		if (!atp.piece_priorities.empty())
		{
			// write piece priorities
			entry::string_type& prio = ret["piece_priority"].string();
			prio.reserve(atp.piece_priorities.size());
			for (auto const p : atp.piece_priorities)
				prio.push_back(static_cast<char>(static_cast<std::uint8_t>(p)));
		}

		return ret;
	}